

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Node * __thiscall Parser::var_declaration(Node *__return_storage_ptr__,Parser *this)

{
  nodekind kind_00;
  lexemtype lVar1;
  ostream *poVar2;
  allocator local_89;
  string local_88 [39];
  undefined1 local_61;
  undefined1 local_60 [8];
  Node assignNode;
  lexemtype type;
  nodekind kind;
  Parser *this_local;
  Node *declNode;
  
  assignNode.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x10;
  assignNode.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = getLexemType(this);
  switch((lexemtype)
         assignNode.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
  case INTKW:
    assignNode.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = INT_DECL;
    break;
  default:
    poVar2 = std::operator<<((ostream *)&std::cout,"Unknown type");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(0);
  case DOUBLEKW:
    assignNode.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = DOUBLE_DECL;
    break;
  case CHARKW:
    assignNode.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = CHAR_DECL;
    break;
  case FLOATKW:
    assignNode.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = FLOAT_DECL;
  }
  Node::Node((Node *)local_60);
  kind_00 = assignNode.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
  local_61 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"",&local_89);
  Node::Node(__return_storage_ptr__,kind_00,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  addDeclVar(this,(lexemtype *)
                  &assignNode.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,(Node *)local_60,__return_storage_ptr__
            );
  while (lVar1 = getLexemType(this), lVar1 != SEMICOLON) {
    lVar1 = getLexemType(this);
    if (lVar1 == COMMA) {
      addDeclVar(this,(lexemtype *)
                      &assignNode.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(Node *)local_60,
                 __return_storage_ptr__);
    }
  }
  lVar1 = getLexemType(this);
  if (lVar1 == SEMICOLON) {
    local_61 = 1;
    Node::~Node((Node *)local_60);
    return __return_storage_ptr__;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"\";\" expected");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

Node Parser::var_declaration() {
    nodekind kind = EMPTY;
    lexemtype type = getLexemType();
    switch (type) {
        case INTKW:
            kind = INT_DECL;
            break;
        case DOUBLEKW:
            kind = DOUBLE_DECL;
            break;
        case FLOATKW:
            kind = FLOAT_DECL;
            break;
        case CHARKW:
            kind = CHAR_DECL;
            break;
        default:
            cout << "Unknown type" << endl;
            exit(0);
    }
    Node assignNode;
    Node declNode = Node(kind);
    addDeclVar(type, assignNode, declNode);
    while (getLexemType() != SEMICOLON) {
        if (getLexemType() == COMMA) {
            addDeclVar(type, assignNode, declNode);
        }
    }
    // todo calculate expression and add it variables map as value
    if (getLexemType() != SEMICOLON) {
        cout << "\";\" expected" << endl;
        exit(0);
    }
    return declNode;
}